

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1147904::Target::DumpInstallPrefix(Value *__return_storage_ptr__,Target *this)

{
  cmMakefile *this_00;
  string *psVar1;
  Value *this_01;
  Value local_a0;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string p;
  Target *this_local;
  Value *prefix;
  
  p.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,objectValue);
  this_00 = this->GT->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_INSTALL_PREFIX",&local_61);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_60);
  std::__cxx11::string::string((string *)local_40,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
  Json::Value::Value(&local_a0,(String *)local_40);
  this_01 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(this_01,&local_a0);
  Json::Value::~Value(&local_a0);
  p.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((p.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInstallPrefix()
{
  Json::Value prefix = Json::objectValue;
  std::string p =
    this->GT->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  cmSystemTools::ConvertToUnixSlashes(p);
  prefix["path"] = p;
  return prefix;
}